

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

PBuffer __thiscall ConvertorXMI2MID::create_track(ConvertorXMI2MID *this,MidiNodes *nodes)

{
  pointer pMVar1;
  pointer pMVar2;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ulong uVar4;
  vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar5;
  __normal_iterator<ConvertorXMI2MID::MidiNode_*,_std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>_>
  __i;
  pointer pMVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  PBuffer PVar10;
  PMutableBuffer data;
  MidiNode node;
  __shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pMVar1 = (in_RDX->
           super__Vector_base<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (in_RDX->
           super__Vector_base<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    uVar4 = (long)pMVar2 - (long)pMVar1 >> 5;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
              (pMVar1,pMVar2,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pMVar2 - (long)pMVar1 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (pMVar1,pMVar2);
    }
    else {
      pMVar6 = pMVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (pMVar1,pMVar6);
      for (; pMVar6 != pMVar2; pMVar6 = pMVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Val_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                  (pMVar6);
      }
    }
  }
  node.time._0_4_ = 0;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&data);
  lVar7 = 0;
  while (_Var3._M_pi = data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
        pMVar1 = (in_RDX->
                 super__Vector_base<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
        (in_RDX->
        super__Vector_base<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>)
        ._M_impl.super__Vector_impl_data._M_start != pMVar1) {
    MidiNode::MidiNode(&node,pMVar1 + -1);
    std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::pop_back
              (in_RDX);
    uVar4 = CONCAT44(node.time._4_4_,(undefined4)node.time) - lVar7;
    std::__shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>);
    uVar8 = (uint)uVar4 & 0x7f;
    iVar5 = 1;
    while (0x7f < uVar4) {
      uVar4 = uVar4 >> 7;
      uVar8 = (uint)uVar4 & 0xff | uVar8 << 8 | 0x80;
      iVar5 = iVar5 + 1;
    }
    while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
      MutableBuffer::push<unsigned_char>(local_50._M_ptr,(uchar)uVar8,1);
      uVar8 = uVar8 >> 8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    lVar7 = CONCAT44(node.time._4_4_,(undefined4)node.time);
    MutableBuffer::push<unsigned_char>
              (data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,node.type,1
              );
    MutableBuffer::push<unsigned_char>
              (data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,node.data1,
               1);
    if ((node._12_4_ & 0xf0 | 0x10) != 0xd0) {
      MutableBuffer::push<unsigned_char>
                (data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 node.data2,1);
      this_00 = data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((node.type == 0xff) && (node.data2 != '\0')) {
        std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
        MutableBuffer::push(this_00,(PBuffer *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Convertor)._vptr_Convertor =
       (_func_int **)data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_pi;
  data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorXMI2MID::create_track(MidiNodes *nodes) {
  class CompareByTime {
   public:
    // Return true if first midi node should come before second.
    bool operator()(const MidiNode &m1, const MidiNode &m2) const {
      if (m1.time != m2.time) {
        return m1.time > m2.time;
      }
      return false;
    }
  };

  // Sort the nodes.
  std::sort(nodes->begin(), nodes->end(), CompareByTime());

  PMutableBuffer data = std::make_shared<MutableBuffer>(Buffer::EndianessBig);
  uint64_t time = 0;
  while (!nodes->empty()) {
    MidiNode node = nodes->back();
    nodes->pop_back();

    midi_write_variable_size(node.time - time, data);
    time = node.time;
    data->push<uint8_t>(node.type);
    data->push<uint8_t>(node.data1);
    if (((node.type & 0xF0) != 0xC0) && ((node.type & 0xF0) != 0xD0)) {
      data->push<uint8_t>(node.data2);
      if (node.type == 0xFF) {
        if (node.data2 > 0) {
          data->push(node.buffer);
        }
      }
    }
  }

  return data;
}